

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_reshape_1d(ggml_context *ctx,ggml_tensor *a,int64_t ne0)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  char *pcVar2;
  int line;
  int64_t ne [1];
  
  _Var1 = ggml_is_contiguous_0(a);
  if (_Var1) {
    if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] - ne0 == 0) {
      ne[0] = ne0;
      tensor = ggml_new_tensor_impl(ctx,a->type,1,ne,a,0);
      ggml_format_name(tensor,"%s (reshaped)",a->name);
      tensor->op = GGML_OP_RESHAPE;
      tensor->src[0] = a;
      return tensor;
    }
    pcVar2 = "ggml_nelements(a) == ne0";
    line = 0xc09;
  }
  else {
    pcVar2 = "ggml_is_contiguous(a)";
    line = 0xc08;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_reshape_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_nelements(a) == ne0);

    const int64_t ne[1] = { ne0 };
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 1, ne, a, 0);
    ggml_format_name(result, "%s (reshaped)", a->name);

    result->op     = GGML_OP_RESHAPE;
    result->src[0] = a;

    return result;
}